

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

bech32_error bech32_decode(bech32_DecodedResult *decodedResult,char *str)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  unsigned_long __n;
  long lVar5;
  iterator __first_00;
  exception *anon_var_0;
  undefined1 local_98 [8];
  DecodedResult localResult;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string inputStr;
  char *str_local;
  bech32_DecodedResult *decodedResult_local;
  
  if (decodedResult == (bech32_DecodedResult *)0x0) {
    decodedResult_local._4_4_ = E_BECH32_NULL_ARGUMENT;
  }
  else if (decodedResult->hrp == (char *)0x0) {
    decodedResult_local._4_4_ = E_BECH32_NULL_ARGUMENT;
  }
  else if (decodedResult->dp == (uchar *)0x0) {
    decodedResult_local._4_4_ = E_BECH32_NULL_ARGUMENT;
  }
  else if (str == (char *)0x0) {
    decodedResult_local._4_4_ = E_BECH32_NULL_ARGUMENT;
  }
  else {
    inputStr.field_2._8_8_ = str;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,str,&local_41);
    std::allocator<char>::~allocator(&local_41);
    bech32::DecodedResult::DecodedResult((DecodedResult *)local_98);
    bech32::decode((DecodedResult *)&anon_var_0,(string *)local_40);
    bech32::DecodedResult::operator=((DecodedResult *)local_98,(DecodedResult *)&anon_var_0);
    bech32::DecodedResult::~DecodedResult((DecodedResult *)&anon_var_0);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) ||
       (bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&localResult.hrp.field_2 + 8)), !bVar2)) {
      uVar3 = std::__cxx11::string::size();
      if (decodedResult->hrplen < uVar3) {
        decodedResult_local._4_4_ = E_BECH32_LENGTH_TOO_SHORT;
      }
      else {
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&localResult.hrp.field_2 + 8));
        if (decodedResult->dplen < sVar4) {
          decodedResult_local._4_4_ = E_BECH32_LENGTH_TOO_SHORT;
        }
        else {
          decodedResult->encoding = local_98._0_4_;
          __first._M_current = (char *)std::__cxx11::string::begin();
          __n = std::__cxx11::string::size();
          std::copy_n<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,char*>
                    (__first,__n,decodedResult->hrp);
          pcVar1 = decodedResult->hrp;
          lVar5 = std::__cxx11::string::size();
          pcVar1[lVar5] = '\0';
          this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&localResult.hrp.field_2 + 8);
          __first_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this);
          sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
          std::
          copy_n<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_long,unsigned_char*>
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__first_00._M_current,sVar4,decodedResult->dp);
          decodedResult_local._4_4_ = E_BECH32_SUCCESS;
        }
      }
    }
    else {
      decodedResult_local._4_4_ = E_BECH32_INVALID_CHECKSUM;
    }
    bech32::DecodedResult::~DecodedResult((DecodedResult *)local_98);
    std::__cxx11::string::~string((string *)local_40);
  }
  return decodedResult_local._4_4_;
}

Assistant:

bech32_error bech32_decode(bech32_DecodedResult *decodedResult, char const *str) {

    if(decodedResult == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(decodedResult->hrp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(decodedResult->dp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(str == nullptr)
        return E_BECH32_NULL_ARGUMENT;

    std::string inputStr(str);

    bech32::DecodedResult localResult;
    try {
        localResult = bech32::decode(inputStr);
    } catch (std::exception &) {
        // todo: convert exception message
        return E_BECH32_UNKNOWN_ERROR;
    }

    if(localResult.hrp.empty() && localResult.dp.empty())
        return E_BECH32_INVALID_CHECKSUM;

    if(localResult.hrp.size() > decodedResult->hrplen)
        return E_BECH32_LENGTH_TOO_SHORT;
    if(localResult.dp.size() > decodedResult->dplen)
        return E_BECH32_LENGTH_TOO_SHORT;

    decodedResult->encoding = static_cast<bech32_encoding>(localResult.encoding);
    std::copy_n(localResult.hrp.begin(), localResult.hrp.size(), decodedResult->hrp);
    decodedResult->hrp[localResult.hrp.size()] = '\0';
    std::copy_n(localResult.dp.begin(), localResult.dp.size(), decodedResult->dp);

    return E_BECH32_SUCCESS;
}